

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_find(HSQUIRRELVM v)

{
  bool bVar1;
  SQVM *in_RDI;
  bool res;
  SQInteger n;
  SQObjectPtr temp;
  SQInteger size;
  SQArray *a;
  SQObjectPtr *val;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffff78;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  SQObjectValue in_stack_ffffffffffffff98;
  SQInteger in_stack_ffffffffffffffa0;
  SQArray *in_stack_ffffffffffffffa8;
  bool local_49;
  long local_48;
  SQObjectPtr local_40;
  SQInteger local_30;
  SQObjectValue local_28;
  SQObjectPtr *local_20;
  SQObjectPtr *local_18;
  SQVM *local_10;
  SQInteger local_8;
  
  local_10 = in_RDI;
  local_18 = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  local_20 = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  local_28 = (local_18->super_SQObject)._unVal;
  local_30 = SQArray::Size((SQArray *)0x14684c);
  SQObjectPtr::SQObjectPtr(&local_40);
  local_48 = 0;
  do {
    if (local_30 <= local_48) {
      local_8 = 0;
LAB_00146959:
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
      return local_8;
    }
    local_49 = false;
    SQArray::Get(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (SQObjectPtr *)in_stack_ffffffffffffff98.pTable);
    bVar1 = SQVM::IsEqual(&local_40,local_20,&local_49);
    if ((bVar1) && ((local_49 & 1U) != 0)) {
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff90,local_48);
      SQVM::Push(local_10,in_stack_ffffffffffffff78);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_10);
      local_8 = 1;
      in_stack_ffffffffffffff80 = local_10;
      goto LAB_00146959;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static SQInteger array_find(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQObjectPtr &val = stack_get(v,2);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr temp;
    for(SQInteger n = 0; n < size; n++) {
        bool res = false;
        a->Get(n,temp);
        if(SQVM::IsEqual(temp,val,res) && res) {
            v->Push(n);
            return 1;
        }
    }
    return 0;
}